

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleserver.hpp
# Opt level: O0

StateStatus __thiscall SimpleServer::HttpParser::removeLeadingSpaces(HttpParser *this)

{
  size_t sVar1;
  long lVar2;
  string local_38 [32];
  HttpParser *local_18;
  HttpParser *this_local;
  
  local_18 = this;
  sVar1 = std::__cxx11::string::find_last_of((char *)&this->request,0x11082b);
  this->pos = sVar1;
  if (this->pos == 0xffffffffffffffff) {
    this->pos = 0;
    this_local._4_4_ = FAIL;
  }
  else {
    sVar1 = this->pos;
    lVar2 = std::__cxx11::string::size();
    if (sVar1 == lVar2 - 1U) {
      this_local._4_4_ = READING;
    }
    else {
      std::__cxx11::string::substr((ulong)local_38,(ulong)&this->request);
      std::__cxx11::string::operator=((string *)&this->request,local_38);
      std::__cxx11::string::~string(local_38);
      this->pos = 0;
      this_local._4_4_ = OK;
    }
  }
  return this_local._4_4_;
}

Assistant:

StateStatus removeLeadingSpaces()
		{
			pos = request.find_last_of(SPACES, pos);

			if (pos != std::string::npos)
			{
				if (pos == request.size() - 1)
					return READING;

				request = request.substr(pos + 1);
				pos = 0;

				return OK;
			}
			else
			{
				pos = 0;
				return FAIL;
			}
		}